

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::Inserter::insertOne
          (Inserter *this,qsizetype pos,OrderedScreen *t)

{
  ScreenInfo *pSVar1;
  undefined8 *puVar2;
  QArrayDataPointer<QKmsPlane> *this_00;
  OrderedScreen *pOVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  _drmModeModeInfo *p_Var8;
  Data *pDVar9;
  QKmsPlane *pQVar10;
  OrderedScreen *pOVar11;
  undefined8 uVar12;
  qreal qVar13;
  qreal qVar14;
  drmModePropertyPtr p_Var15;
  drmModePropertyBlobPtr p_Var16;
  QSize QVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  Data *pDVar24;
  int iVar25;
  Representation RVar26;
  bool bVar27;
  undefined7 uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  undefined4 uVar32;
  undefined3 uVar33;
  undefined3 uVar34;
  bool bVar35;
  undefined3 uVar36;
  bool bVar37;
  uint32_t uVar38;
  long lVar39;
  long lVar40;
  
  pOVar3 = this->begin;
  lVar39 = this->size;
  pOVar11 = pOVar3 + lVar39;
  this->end = pOVar11;
  this->last = pOVar3 + lVar39 + -1;
  lVar39 = lVar39 - pos;
  this->where = pOVar3 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar39;
  this->sourceCopyAssign = 1;
  if (lVar39 < 1) {
    this->sourceCopyConstruct = 1 - lVar39;
    this->move = 0;
    this->sourceCopyAssign = lVar39;
  }
  pSVar1 = &pOVar11->vinfo;
  if (this->sourceCopyConstruct == 0) {
    iVar25 = pOVar11[-1].vinfo.virtualIndex;
    RVar26.m_i = pOVar11[-1].vinfo.virtualPos.xp.m_i;
    pOVar11->screen = pOVar11[-1].screen;
    *(undefined8 *)((long)&(pOVar11->vinfo).virtualPos.xp.m_i + 1) =
         *(undefined8 *)((long)&pOVar11[-1].vinfo.virtualPos.xp.m_i + 1);
    pSVar1->virtualIndex = iVar25;
    (pSVar1->virtualPos).xp = (Representation)RVar26.m_i;
    pDVar4 = pOVar11[-1].vinfo.output.name.d.d;
    pcVar5 = pOVar11[-1].vinfo.output.name.d.ptr;
    pOVar11[-1].vinfo.output.name.d.d = (Data *)0x0;
    pOVar11[-1].vinfo.output.name.d.ptr = (char16_t *)0x0;
    (pOVar11->vinfo).output.name.d.d = pDVar4;
    (pOVar11->vinfo).output.name.d.ptr = pcVar5;
    qVar6 = pOVar11[-1].vinfo.output.name.d.size;
    pOVar11[-1].vinfo.output.name.d.size = 0;
    (pOVar11->vinfo).output.name.d.size = qVar6;
    (pOVar11->vinfo).output.saved_crtc = pOVar11[-1].vinfo.output.saved_crtc;
    iVar25 = pOVar11[-1].vinfo.output.mode;
    bVar27 = pOVar11[-1].vinfo.output.mode_set;
    uVar28 = *(undefined7 *)&pOVar11[-1].vinfo.output.field_0x41;
    (pOVar11->vinfo).output.preferred_mode = pOVar11[-1].vinfo.output.preferred_mode;
    (pOVar11->vinfo).output.mode = iVar25;
    (pOVar11->vinfo).output.mode_set = bVar27;
    *(undefined7 *)&(pOVar11->vinfo).output.field_0x41 = uVar28;
    qVar13 = pOVar11[-1].vinfo.output.physical_size.ht;
    (pOVar11->vinfo).output.physical_size.wd = pOVar11[-1].vinfo.output.physical_size.wd;
    (pOVar11->vinfo).output.physical_size.ht = qVar13;
    uVar29 = pOVar11[-1].vinfo.output.crtc_index;
    uVar30 = pOVar11[-1].vinfo.output.crtc_id;
    uVar32 = *(undefined4 *)&pOVar11[-1].vinfo.output.field_0x24;
    (pOVar11->vinfo).output.connector_id = pOVar11[-1].vinfo.output.connector_id;
    (pOVar11->vinfo).output.crtc_index = uVar29;
    (pOVar11->vinfo).output.crtc_id = uVar30;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x24 = uVar32;
    pDVar7 = pOVar11[-1].vinfo.output.modes.d.d;
    p_Var8 = pOVar11[-1].vinfo.output.modes.d.ptr;
    pOVar11[-1].vinfo.output.modes.d.d = (Data *)0x0;
    pOVar11[-1].vinfo.output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar11->vinfo).output.modes.d.d = pDVar7;
    (pOVar11->vinfo).output.modes.d.ptr = p_Var8;
    qVar6 = pOVar11[-1].vinfo.output.modes.d.size;
    pOVar11[-1].vinfo.output.modes.d.size = 0;
    (pOVar11->vinfo).output.modes.d.size = qVar6;
    uVar29 = pOVar11[-1].vinfo.output.forced_plane_id;
    bVar27 = pOVar11[-1].vinfo.output.forced_plane_set;
    uVar33 = *(undefined3 *)&pOVar11[-1].vinfo.output.field_0x89;
    uVar30 = pOVar11[-1].vinfo.output.drm_format;
    bVar35 = pOVar11[-1].vinfo.output.drm_format_requested_by_user;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 =
         *(undefined3 *)&pOVar11[-1].vinfo.output.field_0x81;
    (pOVar11->vinfo).output.forced_plane_id = uVar29;
    (pOVar11->vinfo).output.forced_plane_set = bVar27;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x89 = uVar33;
    (pOVar11->vinfo).output.drm_format = uVar30;
    (pOVar11->vinfo).output.drm_format_requested_by_user = bVar35;
    bVar27 = pOVar11[-1].vinfo.output.wants_forced_plane;
    uVar33 = *(undefined3 *)&pOVar11[-1].vinfo.output.field_0x81;
    uVar29 = pOVar11[-1].vinfo.output.forced_plane_id;
    (pOVar11->vinfo).output.edid_blob = pOVar11[-1].vinfo.output.edid_blob;
    (pOVar11->vinfo).output.wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 = uVar33;
    (pOVar11->vinfo).output.forced_plane_id = uVar29;
    uVar32 = *(undefined4 *)&pOVar11[-1].vinfo.output.field_0x6c;
    p_Var15 = pOVar11[-1].vinfo.output.dpms_prop;
    (pOVar11->vinfo).output.subpixel = pOVar11[-1].vinfo.output.subpixel;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x6c = uVar32;
    (pOVar11->vinfo).output.dpms_prop = p_Var15;
    pDVar4 = pOVar11[-1].vinfo.output.clone_source.d.d;
    pcVar5 = pOVar11[-1].vinfo.output.clone_source.d.ptr;
    pOVar11[-1].vinfo.output.clone_source.d.d = (Data *)0x0;
    pOVar11[-1].vinfo.output.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar11->vinfo).output.clone_source.d.d = pDVar4;
    (pOVar11->vinfo).output.clone_source.d.ptr = pcVar5;
    qVar6 = pOVar11[-1].vinfo.output.clone_source.d.size;
    pOVar11[-1].vinfo.output.clone_source.d.size = 0;
    (pOVar11->vinfo).output.clone_source.d.size = qVar6;
    pDVar9 = pOVar11[-1].vinfo.output.available_planes.d.d;
    pQVar10 = pOVar11[-1].vinfo.output.available_planes.d.ptr;
    pOVar11[-1].vinfo.output.available_planes.d.d = (Data *)0x0;
    pOVar11[-1].vinfo.output.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar11->vinfo).output.available_planes.d.d = pDVar9;
    (pOVar11->vinfo).output.available_planes.d.ptr = pQVar10;
    qVar6 = pOVar11[-1].vinfo.output.available_planes.d.size;
    pOVar11[-1].vinfo.output.available_planes.d.size = 0;
    (pOVar11->vinfo).output.available_planes.d.size = qVar6;
    pQVar10 = pOVar11[-1].vinfo.output.eglfs_plane;
    QVar17 = pOVar11[-1].vinfo.output.size;
    uVar29 = pOVar11[-1].vinfo.output.modeIdPropertyId;
    uVar30 = pOVar11[-1].vinfo.output.activePropertyId;
    uVar31 = pOVar11[-1].vinfo.output.mode_blob_id;
    (pOVar11->vinfo).output.crtcIdPropertyId = pOVar11[-1].vinfo.output.crtcIdPropertyId;
    (pOVar11->vinfo).output.modeIdPropertyId = uVar29;
    (pOVar11->vinfo).output.activePropertyId = uVar30;
    (pOVar11->vinfo).output.mode_blob_id = uVar31;
    (pOVar11->vinfo).output.eglfs_plane = pQVar10;
    (pOVar11->vinfo).output.size = QVar17;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar40 = 0;
      lVar39 = 0;
      do {
        pOVar11 = this->last;
        puVar2 = (undefined8 *)((long)&pOVar11->screen + lVar40);
        *puVar2 = puVar2[-0x20];
        puVar2[1] = puVar2[-0x1f];
        *(undefined8 *)((long)puVar2 + 0xd) = *(undefined8 *)((long)puVar2 + -0xf3);
        uVar12 = puVar2[3];
        uVar18 = puVar2[4];
        puVar2[3] = puVar2[-0x1d];
        puVar2[4] = puVar2[-0x1c];
        puVar2[-0x1d] = uVar12;
        puVar2[-0x1c] = uVar18;
        uVar12 = puVar2[5];
        puVar2[5] = puVar2[-0x1b];
        puVar2[-0x1b] = uVar12;
        puVar2[6] = puVar2[-0x1a];
        puVar2[7] = puVar2[-0x19];
        puVar2[8] = puVar2[-0x18];
        puVar2[9] = puVar2[-0x17];
        puVar2[10] = puVar2[-0x16];
        puVar2[0xb] = puVar2[-0x15];
        puVar2[0xc] = puVar2[-0x14];
        QArrayDataPointer<_drmModeModeInfo>::operator=
                  ((QArrayDataPointer<_drmModeModeInfo> *)(puVar2 + 0xd),
                   (QArrayDataPointer<_drmModeModeInfo> *)((long)pOVar11 + lVar40 + -0x98));
        uVar12 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x78);
        uVar18 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x70);
        uVar19 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x68);
        uVar20 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x67);
        uVar21 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x5f);
        uVar22 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x50);
        uVar23 = *(undefined8 *)((long)pOVar11 + lVar40 + -0x48);
        puVar2[0x10] = *(undefined8 *)((long)pOVar11 + lVar40 + -0x80);
        puVar2[0x11] = uVar12;
        puVar2[0x12] = uVar18;
        puVar2[0x13] = uVar19;
        *(undefined8 *)((long)puVar2 + 0x99) = uVar20;
        *(undefined8 *)((long)puVar2 + 0xa1) = uVar21;
        uVar12 = puVar2[0x16];
        uVar18 = puVar2[0x17];
        puVar2[0x16] = uVar22;
        puVar2[0x17] = uVar23;
        *(undefined8 *)((long)pOVar11 + lVar40 + -0x50) = uVar12;
        *(undefined8 *)((long)pOVar11 + lVar40 + -0x48) = uVar18;
        uVar12 = puVar2[0x18];
        puVar2[0x18] = *(undefined8 *)((long)pOVar11 + lVar40 + -0x40);
        *(undefined8 *)((long)pOVar11 + lVar40 + -0x40) = uVar12;
        this_00 = (QArrayDataPointer<QKmsPlane> *)
                  ((long)&(pOVar11->vinfo).output.available_planes.d.d + lVar40);
        QArrayDataPointer<QKmsPlane>::operator=
                  (this_00,(QArrayDataPointer<QKmsPlane> *)((long)pOVar11 + lVar40 + -0x38));
        pDVar9 = *(Data **)((long)pOVar11 + lVar40 + -0x20);
        pQVar10 = *(QKmsPlane **)((long)pOVar11 + lVar40 + -0x18);
        pDVar24 = *(Data **)((long)pOVar11 + lVar40 + -8);
        this_00[1].size = *(qsizetype *)((long)pOVar11 + lVar40 + -0x10);
        this_00[2].d = pDVar24;
        this_00[1].d = pDVar9;
        this_00[1].ptr = pQVar10;
        lVar39 = lVar39 + -1;
        lVar40 = lVar40 + -0x100;
      } while (lVar39 != this->move);
    }
    pOVar11 = this->where;
    pOVar11->screen = t->screen;
    RVar26.m_i = (t->vinfo).virtualPos.xp.m_i;
    uVar12 = *(undefined8 *)((long)&(t->vinfo).virtualPos.xp.m_i + 1);
    (pOVar11->vinfo).virtualIndex = (t->vinfo).virtualIndex;
    (pOVar11->vinfo).virtualPos.xp = (Representation)RVar26.m_i;
    *(undefined8 *)((long)&(pOVar11->vinfo).virtualPos.xp.m_i + 1) = uVar12;
    pDVar4 = (pOVar11->vinfo).output.name.d.d;
    (pOVar11->vinfo).output.name.d.d = (t->vinfo).output.name.d.d;
    (t->vinfo).output.name.d.d = pDVar4;
    pcVar5 = (pOVar11->vinfo).output.name.d.ptr;
    (pOVar11->vinfo).output.name.d.ptr = (t->vinfo).output.name.d.ptr;
    (t->vinfo).output.name.d.ptr = pcVar5;
    qVar6 = (pOVar11->vinfo).output.name.d.size;
    (pOVar11->vinfo).output.name.d.size = (t->vinfo).output.name.d.size;
    (t->vinfo).output.name.d.size = qVar6;
    (pOVar11->vinfo).output.saved_crtc = (t->vinfo).output.saved_crtc;
    uVar29 = (t->vinfo).output.connector_id;
    uVar30 = (t->vinfo).output.crtc_index;
    uVar31 = (t->vinfo).output.crtc_id;
    uVar32 = *(undefined4 *)&(t->vinfo).output.field_0x24;
    qVar13 = (t->vinfo).output.physical_size.wd;
    qVar14 = (t->vinfo).output.physical_size.ht;
    iVar25 = (t->vinfo).output.mode;
    bVar27 = (t->vinfo).output.mode_set;
    uVar28 = *(undefined7 *)&(t->vinfo).output.field_0x41;
    (pOVar11->vinfo).output.preferred_mode = (t->vinfo).output.preferred_mode;
    (pOVar11->vinfo).output.mode = iVar25;
    (pOVar11->vinfo).output.mode_set = bVar27;
    *(undefined7 *)&(pOVar11->vinfo).output.field_0x41 = uVar28;
    (pOVar11->vinfo).output.physical_size.wd = qVar13;
    (pOVar11->vinfo).output.physical_size.ht = qVar14;
    (pOVar11->vinfo).output.connector_id = uVar29;
    (pOVar11->vinfo).output.crtc_index = uVar30;
    (pOVar11->vinfo).output.crtc_id = uVar31;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x24 = uVar32;
    QArrayDataPointer<_drmModeModeInfo>::operator=
              (&(pOVar11->vinfo).output.modes.d,&(t->vinfo).output.modes.d);
    uVar32 = *(undefined4 *)&(t->vinfo).output.field_0x6c;
    p_Var15 = (t->vinfo).output.dpms_prop;
    p_Var16 = (t->vinfo).output.edid_blob;
    bVar27 = (t->vinfo).output.wants_forced_plane;
    uVar33 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar29 = (t->vinfo).output.forced_plane_id;
    uVar34 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar30 = (t->vinfo).output.forced_plane_id;
    bVar35 = (t->vinfo).output.forced_plane_set;
    uVar36 = *(undefined3 *)&(t->vinfo).output.field_0x89;
    uVar31 = (t->vinfo).output.drm_format;
    bVar37 = (t->vinfo).output.drm_format_requested_by_user;
    (pOVar11->vinfo).output.subpixel = (t->vinfo).output.subpixel;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x6c = uVar32;
    (pOVar11->vinfo).output.dpms_prop = p_Var15;
    (pOVar11->vinfo).output.edid_blob = p_Var16;
    (pOVar11->vinfo).output.wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 = uVar33;
    (pOVar11->vinfo).output.forced_plane_id = uVar29;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 = uVar34;
    (pOVar11->vinfo).output.forced_plane_id = uVar30;
    (pOVar11->vinfo).output.forced_plane_set = bVar35;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x89 = uVar36;
    (pOVar11->vinfo).output.drm_format = uVar31;
    (pOVar11->vinfo).output.drm_format_requested_by_user = bVar37;
    pDVar4 = (pOVar11->vinfo).output.clone_source.d.d;
    (pOVar11->vinfo).output.clone_source.d.d = (t->vinfo).output.clone_source.d.d;
    (t->vinfo).output.clone_source.d.d = pDVar4;
    pcVar5 = (pOVar11->vinfo).output.clone_source.d.ptr;
    (pOVar11->vinfo).output.clone_source.d.ptr = (t->vinfo).output.clone_source.d.ptr;
    (t->vinfo).output.clone_source.d.ptr = pcVar5;
    qVar6 = (pOVar11->vinfo).output.clone_source.d.size;
    (pOVar11->vinfo).output.clone_source.d.size = (t->vinfo).output.clone_source.d.size;
    (t->vinfo).output.clone_source.d.size = qVar6;
    QArrayDataPointer<QKmsPlane>::operator=
              (&(pOVar11->vinfo).output.available_planes.d,&(t->vinfo).output.available_planes.d);
    QVar17 = (t->vinfo).output.size;
    uVar29 = (t->vinfo).output.crtcIdPropertyId;
    uVar30 = (t->vinfo).output.modeIdPropertyId;
    uVar31 = (t->vinfo).output.activePropertyId;
    uVar38 = (t->vinfo).output.mode_blob_id;
    (pOVar11->vinfo).output.eglfs_plane = (t->vinfo).output.eglfs_plane;
    (pOVar11->vinfo).output.size = QVar17;
    (pOVar11->vinfo).output.crtcIdPropertyId = uVar29;
    (pOVar11->vinfo).output.modeIdPropertyId = uVar30;
    (pOVar11->vinfo).output.activePropertyId = uVar31;
    (pOVar11->vinfo).output.mode_blob_id = uVar38;
  }
  else {
    pOVar11->screen = t->screen;
    iVar25 = (t->vinfo).virtualIndex;
    RVar26.m_i = (t->vinfo).virtualPos.xp.m_i;
    *(undefined8 *)((long)&(pOVar11->vinfo).virtualPos.xp.m_i + 1) =
         *(undefined8 *)((long)&(t->vinfo).virtualPos.xp.m_i + 1);
    pSVar1->virtualIndex = iVar25;
    (pSVar1->virtualPos).xp = (Representation)RVar26.m_i;
    pDVar4 = (t->vinfo).output.name.d.d;
    (t->vinfo).output.name.d.d = (Data *)0x0;
    (pOVar11->vinfo).output.name.d.d = pDVar4;
    pcVar5 = (t->vinfo).output.name.d.ptr;
    (t->vinfo).output.name.d.ptr = (char16_t *)0x0;
    (pOVar11->vinfo).output.name.d.ptr = pcVar5;
    qVar6 = (t->vinfo).output.name.d.size;
    (t->vinfo).output.name.d.size = 0;
    (pOVar11->vinfo).output.name.d.size = qVar6;
    (pOVar11->vinfo).output.saved_crtc = (t->vinfo).output.saved_crtc;
    uVar29 = (t->vinfo).output.connector_id;
    uVar30 = (t->vinfo).output.crtc_index;
    uVar31 = (t->vinfo).output.crtc_id;
    uVar32 = *(undefined4 *)&(t->vinfo).output.field_0x24;
    qVar13 = (t->vinfo).output.physical_size.wd;
    qVar14 = (t->vinfo).output.physical_size.ht;
    iVar25 = (t->vinfo).output.mode;
    bVar27 = (t->vinfo).output.mode_set;
    uVar28 = *(undefined7 *)&(t->vinfo).output.field_0x41;
    (pOVar11->vinfo).output.preferred_mode = (t->vinfo).output.preferred_mode;
    (pOVar11->vinfo).output.mode = iVar25;
    (pOVar11->vinfo).output.mode_set = bVar27;
    *(undefined7 *)&(pOVar11->vinfo).output.field_0x41 = uVar28;
    (pOVar11->vinfo).output.physical_size.wd = qVar13;
    (pOVar11->vinfo).output.physical_size.ht = qVar14;
    (pOVar11->vinfo).output.connector_id = uVar29;
    (pOVar11->vinfo).output.crtc_index = uVar30;
    (pOVar11->vinfo).output.crtc_id = uVar31;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x24 = uVar32;
    pDVar7 = (t->vinfo).output.modes.d.d;
    (t->vinfo).output.modes.d.d = (Data *)0x0;
    (pOVar11->vinfo).output.modes.d.d = pDVar7;
    p_Var8 = (t->vinfo).output.modes.d.ptr;
    (t->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar11->vinfo).output.modes.d.ptr = p_Var8;
    qVar6 = (t->vinfo).output.modes.d.size;
    (t->vinfo).output.modes.d.size = 0;
    (pOVar11->vinfo).output.modes.d.size = qVar6;
    uVar32 = *(undefined4 *)&(t->vinfo).output.field_0x6c;
    p_Var15 = (t->vinfo).output.dpms_prop;
    p_Var16 = (t->vinfo).output.edid_blob;
    bVar27 = (t->vinfo).output.wants_forced_plane;
    uVar33 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar29 = (t->vinfo).output.forced_plane_id;
    uVar34 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar30 = (t->vinfo).output.forced_plane_id;
    bVar35 = (t->vinfo).output.forced_plane_set;
    uVar36 = *(undefined3 *)&(t->vinfo).output.field_0x89;
    uVar31 = (t->vinfo).output.drm_format;
    bVar37 = (t->vinfo).output.drm_format_requested_by_user;
    (pOVar11->vinfo).output.subpixel = (t->vinfo).output.subpixel;
    *(undefined4 *)&(pOVar11->vinfo).output.field_0x6c = uVar32;
    (pOVar11->vinfo).output.dpms_prop = p_Var15;
    (pOVar11->vinfo).output.edid_blob = p_Var16;
    (pOVar11->vinfo).output.wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 = uVar33;
    (pOVar11->vinfo).output.forced_plane_id = uVar29;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x81 = uVar34;
    (pOVar11->vinfo).output.forced_plane_id = uVar30;
    (pOVar11->vinfo).output.forced_plane_set = bVar35;
    *(undefined3 *)&(pOVar11->vinfo).output.field_0x89 = uVar36;
    (pOVar11->vinfo).output.drm_format = uVar31;
    (pOVar11->vinfo).output.drm_format_requested_by_user = bVar37;
    pDVar4 = (t->vinfo).output.clone_source.d.d;
    (t->vinfo).output.clone_source.d.d = (Data *)0x0;
    (pOVar11->vinfo).output.clone_source.d.d = pDVar4;
    pcVar5 = (t->vinfo).output.clone_source.d.ptr;
    (t->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar11->vinfo).output.clone_source.d.ptr = pcVar5;
    qVar6 = (t->vinfo).output.clone_source.d.size;
    (t->vinfo).output.clone_source.d.size = 0;
    (pOVar11->vinfo).output.clone_source.d.size = qVar6;
    pDVar9 = (t->vinfo).output.available_planes.d.d;
    (t->vinfo).output.available_planes.d.d = (Data *)0x0;
    (pOVar11->vinfo).output.available_planes.d.d = pDVar9;
    pQVar10 = (t->vinfo).output.available_planes.d.ptr;
    (t->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar11->vinfo).output.available_planes.d.ptr = pQVar10;
    qVar6 = (t->vinfo).output.available_planes.d.size;
    (t->vinfo).output.available_planes.d.size = 0;
    (pOVar11->vinfo).output.available_planes.d.size = qVar6;
    QVar17 = (t->vinfo).output.size;
    uVar29 = (t->vinfo).output.crtcIdPropertyId;
    uVar30 = (t->vinfo).output.modeIdPropertyId;
    uVar31 = (t->vinfo).output.activePropertyId;
    uVar38 = (t->vinfo).output.mode_blob_id;
    (pOVar11->vinfo).output.eglfs_plane = (t->vinfo).output.eglfs_plane;
    (pOVar11->vinfo).output.size = QVar17;
    (pOVar11->vinfo).output.crtcIdPropertyId = uVar29;
    (pOVar11->vinfo).output.modeIdPropertyId = uVar30;
    (pOVar11->vinfo).output.activePropertyId = uVar31;
    (pOVar11->vinfo).output.mode_blob_id = uVar38;
    this->size = this->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }